

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istring.hpp
# Opt level: O2

bool tao::pegtl::internal::
     istring<(char)68,(char)97,(char)116,(char)97,(char)32,(char)66,(char)105,(char)110,(char)97,(char)114,(char)121,(char)32,(char)52>
     ::
     match<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
               (memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in)

{
  iterator_t *piVar1;
  size_t *psVar2;
  char *r;
  bool bVar3;
  
  r = (in->
      super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).m_current.data;
  if ((0xc < (ulong)((long)(in->
                           super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).m_end - (long)r)) &&
     (bVar3 = istring_equal<'D',_'a',_'t',_'a',_'_',_'B',_'i',_'n',_'a',_'r',_'y',_'_',_'4'>::match
                        (r), bVar3)) {
    piVar1 = &(in->
              super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_current;
    piVar1->data = piVar1->data + 0xd;
    psVar2 = &(in->
              super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_current.byte;
    *psVar2 = *psVar2 + 0xd;
    psVar2 = &(in->
              super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_current.byte_in_line;
    *psVar2 = *psVar2 + 0xd;
    return true;
  }
  return false;
}

Assistant:

static bool match( Input& in ) noexcept( noexcept( in.size( 0 ) ) )
            {
               if( in.size( sizeof...( Cs ) ) >= sizeof...( Cs ) ) {
                  if( istring_equal< Cs... >::match( in.current() ) ) {
                     bump_help< result_on_found::success, Input, char, Cs... >( in, sizeof...( Cs ) );
                     return true;
                  }
               }
               return false;
            }